

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectType.h
# Opt level: O0

ObjectType * __thiscall DIS::ObjectType::operator=(ObjectType *this,ObjectType *param_1)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  ObjectType *param_1_local;
  ObjectType *this_local;
  
  uVar1 = param_1->_objectKind;
  uVar2 = param_1->_category;
  uVar3 = param_1->_subcategory;
  this->_domain = param_1->_domain;
  this->_objectKind = uVar1;
  this->_category = uVar2;
  this->_subcategory = uVar3;
  return this;
}

Assistant:

class OPENDIS7_EXPORT ObjectType
{
protected:
  /** Domain of entity (air, surface, subsurface, space, etc) */
  unsigned char _domain; 

  /** country to which the design of the entity is attributed */
  unsigned char _objectKind; 

  /** category of entity */
  unsigned char _category; 

  /** subcategory of entity */
  unsigned char _subcategory; 


 public:
    ObjectType();
    virtual ~ObjectType();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getDomain() const; 
    void setDomain(unsigned char pX); 

    unsigned char getObjectKind() const; 
    void setObjectKind(unsigned char pX); 

    unsigned char getCategory() const; 
    void setCategory(unsigned char pX); 

    unsigned char getSubcategory() const; 
    void setSubcategory(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const ObjectType& rhs) const;
}